

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O0

bool __thiscall
Args::Command::isMisspelledCommand(Command *this,String *nm,StringList *possibleNames)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long *in_RDI;
  value_type *in_stack_ffffffffffffff58;
  string local_70 [48];
  string local_40 [16];
  String *in_stack_ffffffffffffffd0;
  String *in_stack_ffffffffffffffd8;
  
  (**(code **)(*in_RDI + 0x18))();
  bVar1 = details::isMisspelledName(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string(local_40);
  if (bVar1) {
    (**(code **)(*in_RDI + 0x18))();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_RDX,in_stack_ffffffffffffff58);
    std::__cxx11::string::~string(local_70);
  }
  return bVar1;
}

Assistant:

bool isMisspelledCommand(
		//! Name to check (misspelled).
		const String & nm,
		//! List of possible names for the given misspelled name.
		StringList & possibleNames ) const
	{
		if( details::isMisspelledName( nm, name() ) )
		{
			possibleNames.push_back( name() );

			return true;
		}
		else
			return false;
	}